

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* argagg::convert::arg<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (char *s)

{
  char *__s;
  char *pcVar1;
  char *in_RSI;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  size_t len;
  char *local_38;
  unsigned_long local_30;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  if (*in_RSI != '\0') {
    local_38 = in_RSI;
    while (__s = local_38, pcVar1 = strchr(local_38,0x2c), pcVar1 != (char *)0x0) {
      local_30 = (long)pcVar1 - (long)__s;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,unsigned_long&>(in_RDI,&local_38,&local_30);
      local_38 = local_38 + local_30 + 1;
    }
    local_30 = strlen(__s);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,unsigned_long>(in_RDI,&local_38,&local_30);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> arg(const char* s)
  {
    std::vector<std::string> ret {};
    if (std::strlen(s) == 0) {
      return ret;
    }
    while (true) {
      const char* token = std::strchr(s, ',');
      if (token == nullptr) {
        ret.emplace_back(s, std::strlen(s));
        break;
      }
      std::size_t len = static_cast<std::size_t>(token - s);
      ret.emplace_back(s, len);
      s += len + 1;
    }
    return ret;
  }